

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

usize duckdb_yyjson::yyjson_imut_copy(yyjson_val **val_ptr,char **buf_ptr,yyjson_mut_val *mval)

{
  yyjson_val *pyVar1;
  ulong uVar2;
  char *__dest;
  byte bVar3;
  usize uVar4;
  yyjson_mut_val *mval_00;
  ulong uVar5;
  usize uVar6;
  bool bVar7;
  
  pyVar1 = *val_ptr;
  uVar2 = mval->tag;
  bVar3 = ~(byte)uVar2;
  if ((bVar3 & 6) == 0) {
    uVar5 = uVar2 >> 8;
    mval_00 = (yyjson_mut_val *)(mval->uni).u64;
    if ((bVar3 & 7) == 0) {
      if (0xff < uVar2) {
        mval_00 = mval_00->next->next;
      }
      uVar5 = uVar5 * 2;
    }
    else if (uVar2 < 0x100) {
      uVar5 = 0;
    }
    else {
      mval_00 = mval_00->next;
    }
    *val_ptr = pyVar1 + 1;
    uVar6 = 1;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      uVar4 = yyjson_imut_copy(val_ptr,buf_ptr,mval_00);
      uVar6 = uVar6 + uVar4;
      mval_00 = mval_00->next;
    }
    pyVar1->tag = mval->tag;
    (pyVar1->uni).u64 = uVar6 << 4;
  }
  else {
    if (((byte)uVar2 & 3) == 1) {
      __dest = *buf_ptr;
      switchD_016b45db::default(__dest,(mval->uni).ptr,uVar2 >> 8);
      __dest[uVar2 >> 8] = '\0';
      pyVar1->tag = mval->tag;
      (pyVar1->uni).str = __dest;
      *val_ptr = pyVar1 + 1;
      *buf_ptr = __dest + (uVar2 >> 8) + 1;
    }
    else {
      pyVar1->tag = uVar2;
      pyVar1->uni = mval->uni;
      *val_ptr = pyVar1 + 1;
    }
    uVar6 = 1;
  }
  return uVar6;
}

Assistant:

static usize yyjson_imut_copy(yyjson_val **val_ptr, char **buf_ptr,
                              yyjson_mut_val *mval) {
    yyjson_val *val = *val_ptr;
    yyjson_type type = unsafe_yyjson_get_type(mval);
    if (type == YYJSON_TYPE_ARR || type == YYJSON_TYPE_OBJ) {
        yyjson_mut_val *child = (yyjson_mut_val *)mval->uni.ptr;
        usize len = unsafe_yyjson_get_len(mval), i;
        usize val_sum = 1;
        if (type == YYJSON_TYPE_OBJ) {
            if (len) child = child->next->next;
            len <<= 1;
        } else {
            if (len) child = child->next;
        }
        *val_ptr = val + 1;
        for (i = 0; i < len; i++) {
            val_sum += yyjson_imut_copy(val_ptr, buf_ptr, child);
            child = child->next;
        }
        val->tag = mval->tag;
        val->uni.ofs = val_sum * sizeof(yyjson_val);
        return val_sum;
    } else if (type == YYJSON_TYPE_STR || type == YYJSON_TYPE_RAW) {
        char *buf = *buf_ptr;
        usize len = unsafe_yyjson_get_len(mval);
        memcpy((void *)buf, (const void *)mval->uni.str, len);
        buf[len] = '\0';
        val->tag = mval->tag;
        val->uni.str = buf;
        *val_ptr = val + 1;
        *buf_ptr = buf + len + 1;
        return 1;
    } else {
        val->tag = mval->tag;
        val->uni = mval->uni;
        *val_ptr = val + 1;
        return 1;
    }
}